

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O0

json __thiscall
TestServerConnector::VerifyMethodResult(TestServerConnector *this,json *id,json *result)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  reference pvVar4;
  json_value extraout_RDX;
  double dVar5;
  double __x;
  double __x_00;
  Expression_lhs<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
  EVar6;
  json jVar7;
  allocator<char> local_409;
  string local_408;
  bool local_3e5;
  ExpressionDecomposer local_3e4;
  Expression_lhs<bool> local_3e0;
  Result local_3d8;
  String local_3b8;
  undefined1 local_3a0 [8];
  ResultBuilder DOCTEST_RB_3;
  ExpressionDecomposer local_2fc;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_2f8;
  Enum local_2f0;
  Result local_2e8;
  String local_2c8;
  undefined1 local_2b0 [8];
  ResultBuilder DOCTEST_RB_2;
  ExpressionDecomposer local_20c;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_208;
  Enum local_200;
  Result local_1f8;
  String local_1d8;
  undefined1 local_1c0 [8];
  ResultBuilder DOCTEST_RB_1;
  string local_128;
  bool local_105;
  ExpressionDecomposer local_104;
  Expression_lhs<bool> local_100;
  Result local_f8;
  String local_c8;
  undefined1 local_b0 [8];
  ResultBuilder DOCTEST_RB;
  json *result_local;
  json *id_local;
  
  DOCTEST_RB.super_AssertData.m_exception_string._24_8_ = result;
  doctest::String::String(&local_c8,"");
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_b0,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x19,"!has_key(result, \"error\")","",&local_c8);
  doctest::String::~String(&local_c8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_104,DT_REQUIRE);
  uVar2 = DOCTEST_RB.super_AssertData.m_exception_string._24_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"error",
             (allocator<char> *)&DOCTEST_RB_1.super_AssertData.m_exception_string.field_0x1f);
  bVar3 = jsonrpccxx::has_key((json *)uVar2,&local_128);
  local_105 = (bool)(~bVar3 & 1);
  local_100 = doctest::detail::ExpressionDecomposer::operator<<(&local_104,&local_105);
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_f8,(Expression_lhs *)&local_100);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_b0,&local_f8);
  doctest::detail::Result::~Result(&local_f8);
  std::__cxx11::string::~string((string *)&local_128);
  dVar5 = (double)std::allocator<char>::~allocator
                            ((allocator<char> *)
                             &DOCTEST_RB_1.super_AssertData.m_exception_string.field_0x1f);
  doctest::detail::ResultBuilder::log((ResultBuilder *)local_b0,dVar5);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    jVar7 = (json)(*pcVar1)();
    return jVar7;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)local_b0);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_b0);
  doctest::String::String(&local_1d8,"");
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_1c0,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x1a,"result[\"jsonrpc\"] == \"2.0\"","",&local_1d8);
  doctest::String::~String(&local_1d8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_20c,DT_REQUIRE);
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)DOCTEST_RB.super_AssertData.m_exception_string._24_8_,"jsonrpc");
  EVar6 = doctest::detail::ExpressionDecomposer::operator<<(&local_20c,pvVar4);
  DOCTEST_RB_2.super_AssertData.m_exception_string._24_8_ = EVar6.lhs;
  local_200 = EVar6.m_at;
  local_208 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)DOCTEST_RB_2.super_AssertData.m_exception_string._24_8_;
  doctest::detail::
  Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
  ::operator==(&local_1f8,
               (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                *)&local_208,(char (*) [4])"2.0");
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_1c0,&local_1f8);
  doctest::detail::Result::~Result(&local_1f8);
  doctest::detail::ResultBuilder::log((ResultBuilder *)local_1c0,__x);
  if ((extraout_AL_00 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    jVar7 = (json)(*pcVar1)();
    return jVar7;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)local_1c0);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_1c0);
  doctest::String::String(&local_2c8,"");
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_2b0,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x1b,"result[\"id\"] == id","",&local_2c8);
  doctest::String::~String(&local_2c8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_2fc,DT_REQUIRE);
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)DOCTEST_RB.super_AssertData.m_exception_string._24_8_,"id");
  EVar6 = doctest::detail::ExpressionDecomposer::operator<<(&local_2fc,pvVar4);
  DOCTEST_RB_3.super_AssertData.m_exception_string._24_8_ = EVar6.lhs;
  local_2f0 = EVar6.m_at;
  local_2f8 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)DOCTEST_RB_3.super_AssertData.m_exception_string._24_8_;
  doctest::detail::
  Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
  ::operator==(&local_2e8,
               (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                *)&local_2f8,id);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_2b0,&local_2e8);
  doctest::detail::Result::~Result(&local_2e8);
  doctest::detail::ResultBuilder::log((ResultBuilder *)local_2b0,__x_00);
  if ((extraout_AL_01 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    jVar7 = (json)(*pcVar1)();
    return jVar7;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)local_2b0);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2b0);
  doctest::String::String(&local_3b8,"");
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_3a0,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x1c,"has_key(result, \"result\")","",&local_3b8);
  doctest::String::~String(&local_3b8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3e4,DT_REQUIRE);
  uVar2 = DOCTEST_RB.super_AssertData.m_exception_string._24_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"result",&local_409);
  local_3e5 = jsonrpccxx::has_key((json *)uVar2,&local_408);
  local_3e0 = doctest::detail::ExpressionDecomposer::operator<<(&local_3e4,&local_3e5);
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_3d8,(Expression_lhs *)&local_3e0);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_3a0,&local_3d8);
  doctest::detail::Result::~Result(&local_3d8);
  std::__cxx11::string::~string((string *)&local_408);
  dVar5 = (double)std::allocator<char>::~allocator(&local_409);
  doctest::detail::ResultBuilder::log((ResultBuilder *)local_3a0,dVar5);
  if ((extraout_AL_02 & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_3a0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_3a0);
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)DOCTEST_RB.super_AssertData.m_exception_string._24_8_,"result");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)this,pvVar4);
    jVar7.m_value.object = extraout_RDX.object;
    jVar7._0_8_ = this;
    return jVar7;
  }
  pcVar1 = (code *)swi(3);
  jVar7 = (json)(*pcVar1)();
  return jVar7;
}

Assistant:

static json VerifyMethodResult(const json &id, json &result) {
        REQUIRE(!has_key(result, "error"));
        REQUIRE(result["jsonrpc"] == "2.0");
        REQUIRE(result["id"] == id);
        REQUIRE(has_key(result, "result"));
        return result["result"];
    }